

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O1

void __thiscall DSuicider::Tick(DSuicider *this)

{
  ActorFlags *pAVar1;
  ActorFlags2 *pAVar2;
  double dVar3;
  APlayerPawn *source;
  APlayerPawn *inflictor;
  APlayerPawn *pAVar4;
  FName local_14;
  DAngle local_10;
  
  pAVar1 = &(((this->Pawn).field_0.p)->super_AActor).flags;
  pAVar1->Value = pAVar1->Value | 4;
  pAVar2 = &(((this->Pawn).field_0.p)->super_AActor).flags2;
  pAVar2->Value = pAVar2->Value & 0xf7ffffff;
  pAVar4 = (this->Pawn).field_0.p;
  dVar3 = (pAVar4->super_AActor).DamageFactor;
  (pAVar4->super_AActor).DamageFactor = 1.0;
  pAVar4 = (this->Pawn).field_0.p;
  if ((pAVar4 != (APlayerPawn *)0x0) &&
     (((pAVar4->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->Pawn).field_0.p = (APlayerPawn *)0x0;
    pAVar4 = (APlayerPawn *)0x0;
  }
  inflictor = (this->Pawn).field_0.p;
  if ((inflictor != (APlayerPawn *)0x0) &&
     (((inflictor->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->Pawn).field_0.p = (APlayerPawn *)0x0;
    inflictor = (APlayerPawn *)0x0;
  }
  source = (this->Pawn).field_0.p;
  if ((source != (APlayerPawn *)0x0) &&
     (((source->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->Pawn).field_0.p = (APlayerPawn *)0x0;
    source = (APlayerPawn *)0x0;
  }
  local_14.Index = 0xbe;
  local_10.Degrees = 0.0;
  P_DamageMobj(&pAVar4->super_AActor,&inflictor->super_AActor,&source->super_AActor,1000000,
               &local_14,0,&local_10);
  (((this->Pawn).field_0.p)->super_AActor).DamageFactor = dVar3;
  if ((((this->Pawn).field_0.p)->super_AActor).health < 1) {
    pAVar1 = &(((this->Pawn).field_0.p)->super_AActor).flags;
    pAVar1->Value = pAVar1->Value & 0xfffffffb;
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void Tick()
	{
		Pawn->flags |= MF_SHOOTABLE;
		Pawn->flags2 &= ~MF2_INVULNERABLE;
		// Store the player's current damage factor, to restore it later.
		double plyrdmgfact = Pawn->DamageFactor;
		Pawn->DamageFactor = 1.;
		P_DamageMobj (Pawn, Pawn, Pawn, TELEFRAG_DAMAGE, NAME_Suicide);
		Pawn->DamageFactor = plyrdmgfact;
		if (Pawn->health <= 0)
		{
			Pawn->flags &= ~MF_SHOOTABLE;
		}
		Destroy();
	}